

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O2

void __thiscall
chrono::ChIntegrableIIorder::StateGatherDerivative(ChIntegrableIIorder *this,ChStateDelta *Dydt)

{
  int iVar1;
  int n;
  ChStateDelta ma;
  ChStateDelta mv;
  ChStateDelta local_80;
  ChStateDelta local_68;
  Type local_50;
  
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])();
  ChStateDelta::ChStateDelta(&local_68,(long)iVar1,Dydt->integrable);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_80,(long)iVar1,Dydt->integrable);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x18])(this,&local_80);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_50,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Dydt,0,iVar1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_50.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             &local_68.super_ChVectorDynamic<double>);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  n = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_50,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Dydt,(long)iVar1,n);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_50.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             &local_80.super_ChVectorDynamic<double>);
  Eigen::internal::handmade_aligned_free
            (local_80.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_68.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChIntegrableIIorder::StateGatherDerivative(ChStateDelta& Dydt) {
    ChStateDelta mv(GetNcoords_v(), Dydt.GetIntegrable());
    ChStateDelta ma(GetNcoords_v(), Dydt.GetIntegrable());
    StateGatherAcceleration(ma);
    Dydt.segment(0, GetNcoords_v()) = mv;
    Dydt.segment(GetNcoords_v(), GetNcoords_v()) = ma;
}